

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O0

void __thiscall
helics::Translator::Translator(Translator *this,Core *core,string_view translatorName)

{
  long *plVar1;
  string_view actName;
  undefined4 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Core *in_RSI;
  undefined8 *in_RDI;
  Interface *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  InterfaceHandle in_stack_ffffffffffffff84;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_38;
  undefined8 local_30;
  InterfaceHandle local_24 [5];
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_10 = in_RDX;
  uStack_8 = in_RCX;
  memset(local_24,0,4);
  InterfaceHandle::InterfaceHandle(local_24);
  local_38 = local_10;
  local_30 = uStack_8;
  actName._M_str = in_stack_ffffffffffffff78;
  actName._M_len = (size_t)in_RDI;
  Interface::Interface(in_stack_ffffffffffffff68,in_RSI,in_stack_ffffffffffffff84,actName);
  *in_RDI = &PTR__Translator_00926ca8;
  *(undefined1 *)(in_RDI + 7) = 0;
  std::shared_ptr<helics::TranslatorOperations>::shared_ptr
            ((shared_ptr<helics::TranslatorOperations> *)0x31c91d);
  if (in_RDI[1] != 0) {
    plVar1 = (long *)in_RDI[1];
    local_58 = local_10;
    uStack_50 = uStack_8;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78);
    uVar2 = (**(code **)(*plVar1 + 0x1e0))
                      (plVar1,local_58,uStack_50,local_68._M_len,local_68._M_str);
    *(undefined4 *)(in_RDI + 2) = uVar2;
  }
  return;
}

Assistant:

Translator::Translator(Core* core, const std::string_view translatorName):
    Interface(core, InterfaceHandle(), translatorName)
{
    if (mCore != nullptr) {
        handle = mCore->registerTranslator(translatorName, std::string_view{}, std::string_view{});
    }
}